

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::
ansicolor_sink(ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this
              )

{
  bool bVar1;
  FILE *pFVar2;
  mutex_t *pmVar3;
  mapped_type *pmVar4;
  bool local_269;
  key_type local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  key_type local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  key_type local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  key_type local_48 [3];
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *local_10;
  ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this_local;
  
  local_10 = this;
  sink::sink(&this->super_sink);
  (this->super_sink)._vptr_sink = (_func_int **)&PTR__ansicolor_sink_003a3cd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->reset,"\x1b[m",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->bold,"\x1b[1m",local_25);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->dark,"\x1b[2m",&local_26);
  std::allocator<char>::~allocator(&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->underline,"\x1b[4m",&local_27)
  ;
  std::allocator<char>::~allocator(&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->blink,"\x1b[5m",&local_28);
  std::allocator<char>::~allocator(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->reverse,"\x1b[7m",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->concealed,"\x1b[8m",&local_2a)
  ;
  std::allocator<char>::~allocator(&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->clear_line,"\x1b[K",&local_2b)
  ;
  std::allocator<char>::~allocator(&local_2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->black,"\x1b[30m",&local_2c);
  std::allocator<char>::~allocator(&local_2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->red,"\x1b[31m",&local_2d);
  std::allocator<char>::~allocator(&local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->green,"\x1b[32m",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->yellow,"\x1b[33m",&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->blue,"\x1b[34m",&local_30);
  std::allocator<char>::~allocator(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->magenta,"\x1b[35m",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->cyan,"\x1b[36m",&local_32);
  std::allocator<char>::~allocator(&local_32);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->white,"\x1b[37m",&local_33);
  std::allocator<char>::~allocator(&local_33);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_black,"\x1b[40m",&local_34)
  ;
  std::allocator<char>::~allocator(&local_34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_red,"\x1b[41m",&local_35);
  std::allocator<char>::~allocator(&local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_green,"\x1b[42m",&local_36)
  ;
  std::allocator<char>::~allocator(&local_36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->on_yellow,"\x1b[43m",&local_37);
  std::allocator<char>::~allocator(&local_37);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_blue,"\x1b[44m",&local_38);
  std::allocator<char>::~allocator(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->on_magenta,"\x1b[45m",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_cyan,"\x1b[46m",&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->on_white,"\x1b[47m",&local_3b)
  ;
  std::allocator<char>::~allocator(&local_3b);
  pFVar2 = details::console_stdout::stream();
  this->target_file_ = pFVar2;
  pmVar3 = details::console_mutex::mutex();
  this->mutex_ = pmVar3;
  std::
  unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->colors_);
  bVar1 = details::os::in_terminal(this->target_file_);
  local_269 = false;
  if (bVar1) {
    local_269 = details::os::is_color_terminal();
  }
  this->should_do_colors_ = local_269;
  local_48[2] = 0;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,local_48 + 2);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&this->white);
  local_48[1] = 1;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,local_48 + 1);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&this->cyan);
  local_48[0] = info;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,local_48);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&this->green);
  std::operator+(&local_68,&this->yellow,&this->bold);
  local_6c = warn;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,&local_6c);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_90,&this->red,&this->bold);
  local_94 = err;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,&local_94);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_b8,&this->bold,&this->on_red);
  local_c0[1] = 5;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,local_c0 + 1);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_c0[0] = off;
  pmVar4 = std::
           unordered_map<spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<spdlog::level::level_enum>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->colors_,local_c0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&this->reset);
  return;
}

Assistant:

ansicolor_sink()
        : target_file_(TargetStream::stream())
        , mutex_(ConsoleMutex::mutex())

    {
        should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
        colors_[level::trace] = white;
        colors_[level::debug] = cyan;
        colors_[level::info] = green;
        colors_[level::warn] = yellow + bold;
        colors_[level::err] = red + bold;
        colors_[level::critical] = bold + on_red;
        colors_[level::off] = reset;
    }